

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O2

Maybe<capnp::compiler::BrandedDecl> * __thiscall
capnp::compiler::BrandScope::lookupParameter
          (Maybe<capnp::compiler::BrandedDecl> *__return_storage_ptr__,BrandScope *this,
          Resolver *resolver,uint64_t scopeId,uint index)

{
  Reader brand;
  undefined1 auVar1 [32];
  Reader source;
  undefined1 auVar2 [40];
  BrandScope local_258;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [40];
  char local_1c0;
  SegmentReader *local_1b8;
  CapTableReader *pCStack_1b0;
  void *local_1a8;
  WirePointer *pWStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  uint64_t local_188 [2];
  uint64_t local_178;
  Which WStack_170;
  undefined6 uStack_16e;
  Resolver *local_168;
  char local_160;
  SegmentReader *local_158;
  CapTableReader *pCStack_150;
  void *local_148;
  WirePointer *pWStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  ResolvedDecl local_128;
  BrandedDecl local_c8;
  
  do {
    if (this->leafId == scopeId) {
      if ((ulong)index < (this->params).size_) {
        kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                  (&__return_storage_ptr__->ptr,(this->params).ptr + index);
      }
      else if (this->inherited == true) {
        (__return_storage_ptr__->ptr).isSet = false;
      }
      else {
        (*resolver->_vptr_Resolver[2])(local_188,resolver,0x1e);
        local_128.id = local_188[0];
        local_128._8_8_ = local_188[1];
        local_128.scopeId = local_178;
        local_128.kind = WStack_170;
        local_128._26_6_ = uStack_16e;
        local_128.resolver = local_168;
        local_128.brand.ptr.isSet = (bool)local_160;
        if (local_160 != '\0') {
          local_128.brand.ptr.field_1._32_8_ = local_138;
          local_128.brand.ptr.field_1._40_8_ = uStack_130;
          local_128.brand.ptr.field_1.value._reader.data = local_148;
          local_128.brand.ptr.field_1.value._reader.pointers = pWStack_140;
          local_128.brand.ptr.field_1.value._reader.segment = local_158;
          local_128.brand.ptr.field_1.value._reader.capTable = pCStack_150;
          local_1b8 = local_158;
          pCStack_1b0 = pCStack_150;
          local_1a8 = local_148;
          pWStack_1a0 = pWStack_140;
          local_198 = local_138;
          uStack_190 = uStack_130;
        }
        local_258.parent.ptr.ptr = (BrandScope *)0x0;
        local_258.leafId._0_6_ = 0;
        local_258.leafId._6_2_ = 0;
        local_258.leafParamCount = 0;
        local_258.inherited = false;
        local_258._53_1_ = 0;
        local_1c0 = local_160;
        local_258.errorReporter = (ErrorReporter *)0x0;
        local_258.parent.ptr.disposer = (Disposer *)0x0;
        local_258._54_1_ = 7;
        local_258.params.ptr._0_4_ = 0x7fffffff;
        brand.reader._39_1_ = local_258._55_1_;
        brand.reader.structDataSize = 0;
        brand.reader.structPointerCount = 0;
        brand.reader.elementSize = INLINE_COMPOSITE;
        brand.reader._44_4_ = local_258.params.ptr._4_4_;
        brand.reader.nestingLimit = 0x7fffffff;
        auVar1 = ZEXT1632(ZEXT816(0));
        brand.reader.segment = (SegmentReader *)auVar1._0_8_;
        brand.reader.capTable = (CapTableReader *)auVar1._8_8_;
        brand.reader.ptr = (byte *)auVar1._16_8_;
        brand.reader.elementCount = auVar1._24_4_;
        brand.reader.step = auVar1._28_4_;
        evaluateBrand(&local_258,(Resolver *)this,(ResolvedDecl *)resolver,brand,(uint)local_1e8);
        local_1f8 = 0;
        local_208 = 0;
        uStack_200 = 0;
        local_258.params.size_ = 0;
        local_258.params.disposer = (ArrayDisposer *)0x0;
        uStack_1f0 = 0x7fffffff;
        auVar2 = ZEXT1640(ZEXT816(0));
        source._reader._40_8_ = 0x7fffffff;
        source._reader.segment = (SegmentReader *)auVar2._0_8_;
        source._reader.capTable = (CapTableReader *)auVar2._8_8_;
        source._reader.data = (void *)auVar2._16_8_;
        source._reader.pointers = (WirePointer *)auVar2._24_8_;
        source._reader.dataSize = auVar2._32_4_;
        source._reader.pointerCount = auVar2._36_2_;
        source._reader._38_2_ = auVar2._38_2_;
        BrandedDecl::BrandedDecl
                  (&local_c8,&local_128,
                   (Own<capnp::compiler::BrandScope,_std::nullptr_t> *)&local_258,source);
        kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                  (&__return_storage_ptr__->ptr,&local_c8);
        BrandedDecl::~BrandedDecl(&local_c8);
        kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::dispose
                  ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)&local_258);
      }
      return __return_storage_ptr__;
    }
    this = (this->parent).ptr.ptr;
  } while (this != (BrandScope *)0x0);
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
            ((Fault *)&local_c8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.c++"
             ,0x159,FAILED,(char *)0x0,"\"scope is not a parent\"",
             (char (*) [22])"scope is not a parent");
  kj::_::Debug::Fault::fatal((Fault *)&local_c8);
}

Assistant:

kj::Maybe<BrandedDecl> BrandScope::lookupParameter(
    Resolver& resolver, uint64_t scopeId, uint index) {
  // Returns null if the param should be inherited from the client scope.

  if (scopeId == leafId) {
    if (index < params.size()) {
      return params[index];
    } else if (inherited) {
      return kj::none;
    } else {
      // Unbound and not inherited, so return AnyPointer.
      auto decl = resolver.resolveBuiltin(Declaration::BUILTIN_ANY_POINTER);
      return BrandedDecl(decl,
          evaluateBrand(resolver, decl, List<schema::Brand::Scope>::Reader()),
          Expression::Reader());
    }
  } else KJ_IF_SOME(p, parent) {
    return p.get()->lookupParameter(resolver, scopeId, index);
  } else {
    KJ_FAIL_REQUIRE("scope is not a parent");
  }
}